

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  pointer pTVar1;
  _Base_ptr p_Var2;
  pointer this_00;
  string local_70;
  string local_50;
  
  for (p_Var2 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->files)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Unit",(allocator<char> *)&local_50);
    cmXMLWriter::StartElement(xml,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
              (&local_70,fsPath,&this->path,(char (*) [2])0x746d41,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Option",(allocator<char> *)&local_50);
    cmXMLWriter::StartElement(xml,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmStrCat<char_const(&)[13],std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[2]>
              (&local_70,(char (*) [13])"CMake Files\\",virtualFolderPath,&this->path,
               (char (*) [2])0x6cb720);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
  }
  pTVar1 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[2]>
              (&local_70,virtualFolderPath,&this->path,(char (*) [2])0x6cb720);
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[2]>
              (&local_50,fsPath,&this->path,(char (*) [2])0x746d41);
    BuildUnitImpl(this_00,xml,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::string const& f : this->files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", cmStrCat(fsPath, this->path, "/", f));

    xml.StartElement("Option");
    xml.Attribute(
      "virtualFolder",
      cmStrCat("CMake Files\\", virtualFolderPath, this->path, "\\"));
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : this->folders) {
    folder.BuildUnitImpl(xml, cmStrCat(virtualFolderPath, this->path, "\\"),
                         cmStrCat(fsPath, this->path, "/"));
  }
}